

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.cpp
# Opt level: O3

bool __thiscall
bitfoot::Bitfoot::SetEngineOption(Bitfoot *this,string *optionName,string *optionValue)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  int64_t iVar5;
  undefined4 *puVar6;
  undefined1 *puVar7;
  long *plVar8;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pcVar1 = (optionName->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,_optHash._16_8_,_optHash._24_8_ + _optHash._16_8_);
  plVar8 = local_50;
  iVar3 = strcasecmp(pcVar1,(char *)local_50);
  if (plVar8 != local_40) {
    operator_delete(plVar8,local_40[0] + 1);
  }
  if ((iVar3 == 0) &&
     (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optHash,optionValue), bVar2)) {
    iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optHash);
    SetHashSize(this,iVar5);
    return true;
  }
  pcVar1 = (optionName->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,_optClearHash._16_8_,_optClearHash._24_8_ + _optClearHash._16_8_);
  plVar8 = local_50;
  iVar3 = strcasecmp(pcVar1,(char *)local_50);
  if (plVar8 != local_40) {
    operator_delete(plVar8,local_40[0] + 1);
  }
  if (iVar3 == 0) {
    TranspositionTable::_stores = 0;
    TranspositionTable::_hits = 0;
    TranspositionTable::_checkmates = 0;
    TranspositionTable::_stalemates = 0;
    if (DAT_001adcb8 != (void *)0x0) {
      memset(DAT_001adcb8,0,_tt * 0x10 + 0x10);
      return true;
    }
    TranspositionTable::_stores = 0;
    TranspositionTable::_hits = 0;
    TranspositionTable::_checkmates = 0;
    TranspositionTable::_stalemates = 0;
    return true;
  }
  pcVar1 = (optionName->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,_optContempt._16_8_,_optContempt._24_8_ + _optContempt._16_8_);
  plVar8 = local_50;
  iVar3 = strcasecmp(pcVar1,(char *)local_50);
  if (plVar8 != local_40) {
    operator_delete(plVar8,local_40[0] + 1);
  }
  if ((iVar3 == 0) &&
     (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optContempt,optionValue), bVar2)) {
    iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optContempt);
    uVar4 = (undefined4)iVar5;
    puVar6 = &_contempt;
  }
  else {
    pcVar1 = (optionName->_M_dataplus)._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,_optDelta._16_8_,_optDelta._24_8_ + _optDelta._16_8_);
    plVar8 = local_50;
    iVar3 = strcasecmp(pcVar1,(char *)local_50);
    if (plVar8 != local_40) {
      operator_delete(plVar8,local_40[0] + 1);
    }
    if ((iVar3 != 0) ||
       (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optDelta,optionValue), !bVar2)) {
      pcVar1 = (optionName->_M_dataplus)._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,_optEXT._16_8_,_optEXT._24_8_ + _optEXT._16_8_);
      plVar8 = local_50;
      iVar3 = strcasecmp(pcVar1,(char *)local_50);
      if (plVar8 != local_40) {
        operator_delete(plVar8,local_40[0] + 1);
      }
      if ((iVar3 == 0) &&
         (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optEXT,optionValue), bVar2)) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,_optEXT._48_8_,_optEXT._56_8_ + _optEXT._48_8_);
        plVar8 = local_50;
        if (local_48 == DAT_001532b0) {
          if (local_48 == 0) {
            bVar2 = true;
          }
          else {
            iVar3 = bcmp(local_50,_TRUE_abi_cxx11_,local_48);
            bVar2 = iVar3 == 0;
          }
        }
        else {
          bVar2 = false;
        }
        puVar7 = &_ext;
      }
      else {
        pcVar1 = (optionName->_M_dataplus)._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,_optFutility._16_8_,_optFutility._24_8_ + _optFutility._16_8_
                  );
        plVar8 = local_50;
        iVar3 = strcasecmp(pcVar1,(char *)local_50);
        if (plVar8 != local_40) {
          operator_delete(plVar8,local_40[0] + 1);
        }
        if ((iVar3 == 0) &&
           (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optFutility,optionValue), bVar2))
        {
          iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optFutility);
          uVar4 = (undefined4)iVar5;
          puVar6 = &_futility;
          goto LAB_00106a01;
        }
        pcVar1 = (optionName->_M_dataplus)._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,_optIID._16_8_,_optIID._24_8_ + _optIID._16_8_);
        plVar8 = local_50;
        iVar3 = strcasecmp(pcVar1,(char *)local_50);
        if (plVar8 != local_40) {
          operator_delete(plVar8,local_40[0] + 1);
        }
        if ((iVar3 == 0) &&
           (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optIID,optionValue), bVar2)) {
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,_optIID._48_8_,_optIID._56_8_ + _optIID._48_8_);
          plVar8 = local_50;
          if (local_48 == DAT_001532b0) {
            if (local_48 == 0) {
              bVar2 = true;
            }
            else {
              iVar3 = bcmp(local_50,_TRUE_abi_cxx11_,local_48);
              bVar2 = iVar3 == 0;
            }
          }
          else {
            bVar2 = false;
          }
          puVar7 = &_iid;
        }
        else {
          pcVar1 = (optionName->_M_dataplus)._M_p;
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,_optLMR._16_8_,_optLMR._24_8_ + _optLMR._16_8_);
          plVar8 = local_50;
          iVar3 = strcasecmp(pcVar1,(char *)local_50);
          if (plVar8 != local_40) {
            operator_delete(plVar8,local_40[0] + 1);
          }
          if ((iVar3 == 0) &&
             (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optLMR,optionValue), bVar2)) {
            local_50 = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,_optLMR._48_8_,_optLMR._56_8_ + _optLMR._48_8_);
            plVar8 = local_50;
            if (local_48 == DAT_001532b0) {
              if (local_48 == 0) {
                bVar2 = true;
              }
              else {
                iVar3 = bcmp(local_50,_TRUE_abi_cxx11_,local_48);
                bVar2 = iVar3 == 0;
              }
            }
            else {
              bVar2 = false;
            }
            puVar7 = &_lmr;
          }
          else {
            pcVar1 = (optionName->_M_dataplus)._M_p;
            local_50 = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,_optNMP._16_8_,_optNMP._24_8_ + _optNMP._16_8_);
            plVar8 = local_50;
            iVar3 = strcasecmp(pcVar1,(char *)local_50);
            if (plVar8 != local_40) {
              operator_delete(plVar8,local_40[0] + 1);
            }
            if ((iVar3 == 0) &&
               (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optNMP,optionValue), bVar2))
            {
              local_50 = local_40;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,_optNMP._48_8_,_optNMP._56_8_ + _optNMP._48_8_);
              plVar8 = local_50;
              if (local_48 == DAT_001532b0) {
                if (local_48 == 0) {
                  bVar2 = true;
                }
                else {
                  iVar3 = bcmp(local_50,_TRUE_abi_cxx11_,local_48);
                  bVar2 = iVar3 == 0;
                }
              }
              else {
                bVar2 = false;
              }
              puVar7 = &_nmp;
            }
            else {
              pcVar1 = (optionName->_M_dataplus)._M_p;
              local_50 = local_40;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,_optNMR._16_8_,_optNMR._24_8_ + _optNMR._16_8_);
              plVar8 = local_50;
              iVar3 = strcasecmp(pcVar1,(char *)local_50);
              if (plVar8 != local_40) {
                operator_delete(plVar8,local_40[0] + 1);
              }
              if ((iVar3 == 0) &&
                 (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optNMR,optionValue), bVar2)
                 ) {
                local_50 = local_40;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,_optNMR._48_8_,_optNMR._56_8_ + _optNMR._48_8_);
                plVar8 = local_50;
                if (local_48 == DAT_001532b0) {
                  if (local_48 == 0) {
                    bVar2 = true;
                  }
                  else {
                    iVar3 = bcmp(local_50,_TRUE_abi_cxx11_,local_48);
                    bVar2 = iVar3 == 0;
                  }
                }
                else {
                  bVar2 = false;
                }
                puVar7 = &_nmr;
              }
              else {
                pcVar1 = (optionName->_M_dataplus)._M_p;
                local_50 = local_40;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,_optOneReply._16_8_,
                           _optOneReply._24_8_ + _optOneReply._16_8_);
                plVar8 = local_50;
                iVar3 = strcasecmp(pcVar1,(char *)local_50);
                if (plVar8 != local_40) {
                  operator_delete(plVar8,local_40[0] + 1);
                }
                if ((iVar3 != 0) ||
                   (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optOneReply,optionValue),
                   !bVar2)) {
                  pcVar1 = (optionName->_M_dataplus)._M_p;
                  local_50 = local_40;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_50,_optRZR._16_8_,_optRZR._24_8_ + _optRZR._16_8_);
                  plVar8 = local_50;
                  iVar3 = strcasecmp(pcVar1,(char *)local_50);
                  if (plVar8 != local_40) {
                    operator_delete(plVar8,local_40[0] + 1);
                  }
                  if ((iVar3 == 0) &&
                     (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optRZR,optionValue),
                     bVar2)) {
                    iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optRZR);
                    uVar4 = (undefined4)iVar5;
                    puVar6 = &_rzr;
                  }
                  else {
                    pcVar1 = (optionName->_M_dataplus)._M_p;
                    local_50 = local_40;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_50,_optTempo._16_8_,
                               _optTempo._24_8_ + _optTempo._16_8_);
                    plVar8 = local_50;
                    iVar3 = strcasecmp(pcVar1,(char *)local_50);
                    if (plVar8 != local_40) {
                      operator_delete(plVar8,local_40[0] + 1);
                    }
                    if ((iVar3 == 0) &&
                       (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optTempo,optionValue)
                       , bVar2)) {
                      iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optTempo);
                      uVar4 = (undefined4)iVar5;
                      puVar6 = &_tempo;
                    }
                    else {
                      pcVar1 = (optionName->_M_dataplus)._M_p;
                      local_50 = local_40;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_50,_optTest._16_8_,
                                 _optTest._24_8_ + _optTest._16_8_);
                      plVar8 = local_50;
                      iVar3 = strcasecmp(pcVar1,(char *)local_50);
                      if (plVar8 != local_40) {
                        operator_delete(plVar8,local_40[0] + 1);
                      }
                      if ((iVar3 != 0) ||
                         (bVar2 = senjo::EngineOption::SetValue
                                            ((EngineOption *)_optTest,optionValue), !bVar2)) {
                        return false;
                      }
                      iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optTest);
                      uVar4 = (undefined4)iVar5;
                      puVar6 = (undefined4 *)&_test;
                    }
                  }
                  goto LAB_00106a01;
                }
                local_50 = local_40;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,_optOneReply._48_8_,
                           _optOneReply._56_8_ + _optOneReply._48_8_);
                plVar8 = local_50;
                if (local_48 == DAT_001532b0) {
                  if (local_48 == 0) {
                    bVar2 = true;
                  }
                  else {
                    iVar3 = bcmp(local_50,_TRUE_abi_cxx11_,local_48);
                    bVar2 = iVar3 == 0;
                  }
                }
                else {
                  bVar2 = false;
                }
                puVar7 = &_oneReply;
              }
            }
          }
        }
      }
      *puVar7 = bVar2;
      if (plVar8 == local_40) {
        return true;
      }
      operator_delete(plVar8,local_40[0] + 1);
      return true;
    }
    iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optDelta);
    uVar4 = (undefined4)iVar5;
    puVar6 = &_delta;
  }
LAB_00106a01:
  *puVar6 = uVar4;
  return true;
}

Assistant:

bool Bitfoot::SetEngineOption(const std::string& optionName,
                             const std::string& optionValue)
{
  if (!stricmp(optionName.c_str(), _optHash.GetName().c_str())) {
    if (_optHash.SetValue(optionValue)) {
      SetHashSize(_optHash.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optClearHash.GetName().c_str())) {
    ClearHash();
    return true;
  }
  if (!stricmp(optionName.c_str(), _optContempt.GetName().c_str())) {
    if (_optContempt.SetValue(optionValue)) {
      _contempt = static_cast<int>(_optContempt.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optDelta.GetName().c_str())) {
    if (_optDelta.SetValue(optionValue)) {
      _delta = static_cast<int>(_optDelta.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optEXT.GetName().c_str())) {
    if (_optEXT.SetValue(optionValue)) {
      _ext = (_optEXT.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optFutility.GetName().c_str())) {
    if (_optFutility.SetValue(optionValue)) {
      _futility = static_cast<int>(_optFutility.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optIID.GetName().c_str())) {
    if (_optIID.SetValue(optionValue)) {
      _iid = (_optIID.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optLMR.GetName().c_str())) {
    if (_optLMR.SetValue(optionValue)) {
      _lmr = (_optLMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optNMP.GetName().c_str())) {
    if (_optNMP.SetValue(optionValue)) {
      _nmp = (_optNMP.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optNMR.GetName().c_str())) {
    if (_optNMR.SetValue(optionValue)) {
      _nmr = (_optNMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optOneReply.GetName().c_str())) {
    if (_optOneReply.SetValue(optionValue)) {
      _oneReply = (_optOneReply.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optRZR.GetName().c_str())) {
    if (_optRZR.SetValue(optionValue)) {
      _rzr = static_cast<int>(_optRZR.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTempo.GetName().c_str())) {
    if (_optTempo.SetValue(optionValue)) {
      _tempo = static_cast<int>(_optTempo.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTest.GetName().c_str())) {
    if (_optTest.SetValue(optionValue)) {
      _test = static_cast<int>(_optTest.GetIntValue());
      return true;
    }
  }
  return false;
}